

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O3

void __thiscall
burst::k_ary_search_set<long,std::less<void>>::
fill_node<boost::iterator_range<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>>
          (k_ary_search_set<long,std::less<void>> *this,k_ary_search_set_branch *branch,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *counters,
          iterator_range<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
          *range)

{
  long *plVar1;
  long lVar2;
  reference plVar3;
  pointer puVar4;
  long *plVar5;
  long lVar6;
  long *plVar7;
  long *plVar8;
  ulong uVar9;
  
  puVar4 = (counters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(counters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar4 == 8) {
    lVar6 = *(long *)this;
    lVar2 = 8;
  }
  else {
    uVar9 = 0;
    do {
      plVar3 = boost::iterator_range_detail::
               iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
               ::operator[](&range->
                             super_iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
                            ,puVar4[uVar9] + branch->preceding_elements);
      lVar6 = *(long *)this;
      *(long *)(lVar6 + branch->index * 8 + uVar9 * 8) = *plVar3;
      uVar9 = uVar9 + 1;
      puVar4 = (counters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_start;
      lVar2 = (long)(counters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar4;
    } while (uVar9 < (lVar2 >> 3) - 1U);
  }
  plVar8 = (long *)(lVar6 + branch->index * 8);
  plVar5 = (long *)((long)plVar8 + lVar2 + -8);
  if (plVar8 != plVar5) {
    lVar2 = lVar2 + -0x10;
    plVar7 = plVar8;
    do {
      if (lVar2 == 0) {
        return;
      }
      plVar8 = plVar7 + 1;
      plVar1 = plVar7 + 1;
      lVar2 = lVar2 + -8;
      lVar6 = *plVar7;
      plVar7 = plVar8;
    } while (lVar6 <= *plVar1);
  }
  if (plVar8 == plVar5) {
    return;
  }
  __assert_fail("std::is_sorted ( m_values.begin() + static_cast<difference_type>(branch.index), m_values.begin() + static_cast<difference_type>(branch.index + counters.size() - 1), m_compare )"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/k_ary_search_set.hpp"
                ,0x1bc,
                "void burst::k_ary_search_set<long>::fill_node(const k_ary_search_set_branch &, const std::vector<std::size_t> &, const RandomAccessRange &) [Value = long, Compare = std::less<void>, RandomAccessRange = boost::iterator_range<__gnu_cxx::__normal_iterator<long *, std::vector<long>>>]"
               );
}

Assistant:

void
            fill_node
            (
                const k_ary_search_set_branch & branch,
                const std::vector<std::size_t> & counters,
                const RandomAccessRange & range
            )
        {
            for
            (
                std::size_t element_index = 0;
                element_index < counters.size() - 1;
                ++element_index
            )
            {
                using difference_type = typename RandomAccessRange::difference_type;
                const auto index_in_initial_range =
                    static_cast<difference_type>
                    (
                        branch.preceding_elements + counters[element_index]
                    );
                m_values[branch.index + element_index] = range[index_in_initial_range];
            }
            BOOST_ASSERT(std::is_sorted
            (
                m_values.begin() + static_cast<difference_type>(branch.index),
                m_values.begin() + static_cast<difference_type>(branch.index + counters.size() - 1),
                m_compare
            ));
        }